

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void SkipSpace(ConfigScanner *sc)

{
  char *pcVar1;
  
  if (sc != (ConfigScanner *)0x0) {
    pcVar1 = sc->ptr;
    while( true ) {
      if ((*pcVar1 != ' ') && (*pcVar1 != '\t')) break;
      sc->ptr = pcVar1 + 1;
      pcVar1 = pcVar1 + 1;
    }
  }
  return;
}

Assistant:

void SkipSpace(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	while (true)
	{
		switch (*sc->ptr)
		{
		case ' ':
		case '\t':
			sc->ptr++;
			continue;
		}
		return;
	}
}